

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Image.c
# Opt level: O3

void Llb_Nonlin4CheckVars(Llb_Mgr_t_conflict *p)

{
  long lVar1;
  
  if (0 < (long)p->nVars) {
    lVar1 = 0;
    do {
      if ((p->pVars[lVar1] != (Llb_Var_t *)0x0) && (p->pVars[lVar1]->vParts->nSize < 2)) {
        __assert_fail("Vec_IntSize(pVar->vParts) > 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb4Image.c"
                      ,0x23b,"void Llb_Nonlin4CheckVars(Llb_Mgr_t *)");
      }
      lVar1 = lVar1 + 1;
    } while (p->nVars != lVar1);
  }
  return;
}

Assistant:

void Llb_Nonlin4CheckVars( Llb_Mgr_t * p )
{
    Llb_Var_t * pVar;
    int i;
    Llb_MgrForEachVar( p, pVar, i )
        assert( Vec_IntSize(pVar->vParts) > 1 );
}